

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void pi_update_decode_not_poc
               (opj_pi_iterator_t *p_pi,opj_tcp_v2_t *p_tcp,OPJ_UINT32 p_max_precision,
               OPJ_UINT32 p_max_res)

{
  OPJ_UINT32 OVar1;
  opj_pi_iterator_t *l_current_pi;
  OPJ_UINT32 l_bound;
  OPJ_UINT32 pino;
  OPJ_UINT32 p_max_res_local;
  OPJ_UINT32 p_max_precision_local;
  opj_tcp_v2_t *p_tcp_local;
  opj_pi_iterator_t *p_pi_local;
  
  OVar1 = p_tcp->numpocs;
  l_current_pi = p_pi;
  for (pino = 0; pino < OVar1 + 1; pino = pino + 1) {
    (l_current_pi->poc).prg = p_tcp->prg;
    l_current_pi->first = 1;
    (l_current_pi->poc).resno0 = 0;
    (l_current_pi->poc).compno0 = 0;
    (l_current_pi->poc).layno0 = 0;
    (l_current_pi->poc).precno0 = 0;
    (l_current_pi->poc).resno1 = p_max_res;
    (l_current_pi->poc).compno1 = l_current_pi->numcomps;
    (l_current_pi->poc).layno1 = p_tcp->numlayers;
    (l_current_pi->poc).precno1 = p_max_precision;
    l_current_pi = l_current_pi + 1;
  }
  return;
}

Assistant:

void pi_update_decode_not_poc (opj_pi_iterator_t * p_pi,opj_tcp_v2_t * p_tcp,OPJ_UINT32 p_max_precision,OPJ_UINT32 p_max_res)
{
	// loop
	OPJ_UINT32 pino;

	// encoding prameters to set
	OPJ_UINT32 l_bound;

	opj_pi_iterator_t * l_current_pi = 00;
	// preconditions in debug
	assert(p_tcp != 00);
	assert(p_pi != 00);

	// initializations
	l_bound = p_tcp->numpocs+1;
	l_current_pi = p_pi;

	for
		(pino = 0;pino<l_bound;++pino)
	{
		l_current_pi->poc.prg = p_tcp->prg;
		l_current_pi->first = 1;
		l_current_pi->poc.resno0 = 0;
		l_current_pi->poc.compno0 = 0;
		l_current_pi->poc.layno0 = 0;
		l_current_pi->poc.precno0 = 0;
		l_current_pi->poc.resno1 = p_max_res;
		l_current_pi->poc.compno1 = l_current_pi->numcomps;
		l_current_pi->poc.layno1 = p_tcp->numlayers;
		l_current_pi->poc.precno1 = p_max_precision;
		++l_current_pi;
	}
}